

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O0

void Llb4_Nonlin4SweepExperiment(Aig_Man_t *pAig)

{
  Vec_Ptr_t *local_28;
  Vec_Ptr_t *vGroups;
  Vec_Int_t *vOrder;
  DdManager *dd;
  Aig_Man_t *pAig_local;
  
  dd = (DdManager *)pAig;
  Llb4_Nonlin4Sweep(pAig,100,500,(DdManager **)&vOrder,(Vec_Int_t **)&vGroups,&local_28,1);
  Llb_Nonlin4SweepDeref((DdManager *)vOrder,local_28);
  Cudd_RecursiveDeref((DdManager *)vOrder,*(DdNode **)(vOrder + 0x2e));
  Extra_StopManager((DdManager *)vOrder);
  Vec_IntFree((Vec_Int_t *)vGroups);
  return;
}

Assistant:

void Llb4_Nonlin4SweepExperiment( Aig_Man_t * pAig )
{
    DdManager * dd;
    Vec_Int_t * vOrder;
    Vec_Ptr_t * vGroups;
    Llb4_Nonlin4Sweep( pAig, 100, 500, &dd, &vOrder, &vGroups, 1 );

    Llb_Nonlin4SweepDeref( dd, vGroups );

    Cudd_RecursiveDeref( dd, dd->bFunc );
    Extra_StopManager( dd );
    Vec_IntFree( vOrder );
}